

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptorProto::MergeFrom(FieldDescriptorProto *this,Message *from)

{
  FieldDescriptorProto *pFVar1;
  FieldDescriptorProto *in_RDI;
  FieldDescriptorProto *unaff_retaddr;
  FieldDescriptorProto *source;
  Message *in_stack_000003c8;
  Message *in_stack_000003d0;
  
  pFVar1 = DynamicCastToGenerated<google::protobuf::FieldDescriptorProto>(&in_RDI->super_Message);
  if (pFVar1 == (FieldDescriptorProto *)0x0) {
    internal::ReflectionOps::Merge(in_stack_000003d0,in_stack_000003c8);
  }
  else {
    MergeFrom(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void FieldDescriptorProto::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.FieldDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  const FieldDescriptorProto* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<FieldDescriptorProto>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.FieldDescriptorProto)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.FieldDescriptorProto)
    MergeFrom(*source);
  }
}